

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O2

void __thiscall
GenericExceptionCatcher_Tests::GenericExceptionCatcher_paren_operator_test::test_method
          (GenericExceptionCatcher_paren_operator_test *this)

{
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_mittens::DefaultNoAction<void>_> allCatcher
  ;
  
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(GenericExceptionCatcher_paren_operator_test)
{
   auto allCatcher = generic_handler<void>(EXIT_FAILURE); 
   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher());
      }
   }
}